

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarchingCube.cpp
# Opt level: O2

vec3 __thiscall
MarchingCube::computeNormal(MarchingCube *this,Field<double,_unsigned_short> *F,vec3 p)

{
  double dVar1;
  vec<3,_float,_(glm::qualifier)0> vVar2;
  vec3 vVar3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_54;
  float local_50;
  float local_4c;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  undefined8 uVar4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar5;
  
  local_30 = (double)p.field_0.x;
  local_28 = (double)p.field_1.y;
  local_20 = (double)p.field_2.z;
  local_40 = interp(this,F,local_30 + 0.5,local_28,local_20);
  dVar1 = interp(this,F,local_30 + -0.5,local_28,local_20);
  local_40 = local_40 - dVar1;
  local_38 = interp(this,F,local_30,local_28 + 0.5,local_20);
  dVar1 = interp(this,F,local_30,local_28 + -0.5,local_20);
  local_38 = local_38 - dVar1;
  local_48 = interp(this,F,local_30,local_28,local_20 + 0.5);
  dVar1 = interp(this,F,local_30,local_28,local_20 + -0.5);
  local_54.x = (float)local_40;
  local_50 = (float)local_38;
  local_4c = (float)(local_48 - dVar1);
  vVar2 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                    ((vec<3,_float,_(glm::qualifier)0> *)&local_54);
  vVar3.field_0 = vVar2.field_0;
  uVar4._4_4_ = vVar2.field_1;
  register0x00001240 = vVar2.field_2;
  return vVar3;
}

Assistant:

inline glm::vec3 MarchingCube::computeNormal(
        const Field<double, std::uint16_t>& F,
        const glm::vec3 p
    ) const
{
    double divx = 0;
    double divy = 0;
    double divz = 0;
    double const eps = 0.5;
    divx = interp(F, p.x+eps, p.y, p.z) - interp(F, p.x-eps, p.y, p.z);
    divy = interp(F, p.x, p.y+eps, p.z) - interp(F, p.x, p.y-eps, p.z);
    divz = interp(F, p.x, p.y, p.z+eps) - interp(F, p.x, p.y, p.z-eps);
    return glm::normalize(glm::vec3 {divx, divy, divz});
}